

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rank_function.cpp
# Opt level: O1

void __thiscall
duckdb::WindowPercentRankExecutor::EvaluateInternal
          (WindowPercentRankExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  WindowExecutorLocalState *this_00;
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  long *plVar4;
  long *plVar5;
  reference pvVar6;
  long lVar7;
  pointer this_01;
  idx_t iVar8;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> _Var9;
  idx_t iVar10;
  double dVar11;
  undefined1 auVar12 [16];
  
  pdVar1 = result->data;
  this_00 = lstate + 2;
  if (gstate[1].super_WindowExecutorState._vptr_WindowExecutorState == (_func_int **)0x0) {
    pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_00,0);
    plVar4 = (long *)pvVar6->data;
    pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_00,1);
    pdVar2 = pvVar6->data;
    pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_00,2);
    plVar5 = (long *)pvVar6->data;
    lstate[0x12].range_cursor.
    super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
    super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl =
         (WindowCursor *)((*plVar5 - *plVar4) + 1);
    lstate[0x12].super_WindowExecutorState._vptr_WindowExecutorState =
         (_func_int **)(row_idx - *plVar5);
    if (count != 0) {
      iVar10 = 0;
      do {
        if (row_idx + iVar10 == plVar4[iVar10]) {
          lstate[0x11].range_cursor.
          super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
          super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
          .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = (WindowCursor *)0x1;
          _Var9._M_head_impl = (WindowCursor *)0x1;
LAB_017c21dc:
          lstate[0x12].range_cursor.
          super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
          super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
          .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = _Var9._M_head_impl;
          lstate[0x12].super_WindowExecutorState._vptr_WindowExecutorState = (_func_int **)0x0;
        }
        else if (row_idx + iVar10 == plVar5[iVar10]) {
          lstate[0x11].range_cursor.
          super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
          super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
          .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl =
               ((WindowCursor *)
               ((long)&(lstate[0x11].range_cursor.
                        super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
                        .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl)->paged +
               1))._M_head_impl;
          _Var9._M_head_impl =
               (WindowCursor *)
               ((long)&(lstate[0x12].range_cursor.
                        super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
                        .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl)->paged +
               (long)lstate[0x12].super_WindowExecutorState._vptr_WindowExecutorState);
          goto LAB_017c21dc;
        }
        lstate[0x12].super_WindowExecutorState._vptr_WindowExecutorState =
             (_func_int **)
             ((long)lstate[0x12].super_WindowExecutorState._vptr_WindowExecutorState + 1);
        lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                          (~plVar4[iVar10] + *(long *)(pdVar2 + iVar10 * 8));
        if (lVar7 < 1) {
          dVar11 = 0.0;
        }
        else {
          _Var9._M_head_impl =
               lstate[0x12].range_cursor.
               super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
               _M_t.
               super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
               .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
          dVar11 = (((double)CONCAT44(0x45300000,(int)((ulong)_Var9._M_head_impl >> 0x20)) -
                    1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)_Var9._M_head_impl) - 4503599627370496.0) +
                   -1.0) / (double)lVar7;
        }
        *(double *)(pdVar1 + iVar10 * 8) = dVar11;
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
    }
  }
  else {
    pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_00,6);
    pdVar2 = pvVar6->data;
    pvVar6 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_00,7);
    if (count != 0) {
      pdVar3 = pvVar6->data;
      iVar10 = 0;
      do {
        lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                          (~*(ulong *)(pdVar2 + iVar10 * 8) + *(long *)(pdVar3 + iVar10 * 8));
        this_01 = unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                  ::operator->((unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                                *)(gstate + 1));
        iVar8 = WindowTokenTree::Rank
                          (this_01,*(idx_t *)(pdVar2 + iVar10 * 8),*(idx_t *)(pdVar3 + iVar10 * 8),
                           row_idx + iVar10);
        auVar12._8_4_ = (int)(iVar8 >> 0x20);
        auVar12._0_8_ = iVar8;
        auVar12._12_4_ = 0x45300000;
        if (lVar7 < 1) {
          dVar11 = 0.0;
        }
        else {
          dVar11 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)iVar8) - 4503599627370496.0) + -1.0) /
                   (double)lVar7;
        }
        *(double *)(pdVar1 + iVar10 * 8) = dVar11;
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
    }
  }
  return;
}

Assistant:

void WindowPercentRankExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                                 DataChunk &eval_chunk, Vector &result, idx_t count,
                                                 idx_t row_idx) const {
	auto &gpeer = gstate.Cast<WindowPeerGlobalState>();
	auto &lpeer = lstate.Cast<WindowPeerLocalState>();
	auto rdata = FlatVector::GetData<double>(result);

	if (gpeer.token_tree) {
		auto frame_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[FRAME_BEGIN]);
		auto frame_end = FlatVector::GetData<const idx_t>(lpeer.bounds.data[FRAME_END]);
		for (idx_t i = 0; i < count; ++i, ++row_idx) {
			auto denom = static_cast<double>(NumericCast<int64_t>(frame_end[i] - frame_begin[i] - 1));
			const auto rank = gpeer.token_tree->Rank(frame_begin[i], frame_end[i], row_idx);
			double percent_rank = denom > 0 ? ((double)rank - 1) / denom : 0;
			rdata[i] = percent_rank;
		}
		return;
	}

	//	Reset to "previous" row
	auto partition_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PARTITION_BEGIN]);
	auto partition_end = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PARTITION_END]);
	auto peer_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PEER_BEGIN]);
	lpeer.rank = (peer_begin[0] - partition_begin[0]) + 1;
	lpeer.rank_equal = (row_idx - peer_begin[0]);

	for (idx_t i = 0; i < count; ++i, ++row_idx) {
		lpeer.NextRank(partition_begin[i], peer_begin[i], row_idx);
		auto denom = static_cast<double>(NumericCast<int64_t>(partition_end[i] - partition_begin[i] - 1));
		double percent_rank = denom > 0 ? ((double)lpeer.rank - 1) / denom : 0;
		rdata[i] = percent_rank;
	}
}